

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

s32 __thiscall irr::gui::CGUITabControl::getTabAt(CGUITabControl *this,s32 xpos,s32 ypos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  pointer ppIVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  
  plVar4 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  plVar4 = (long *)(**(code **)(*plVar4 + 0x30))(plVar4,0);
  if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
    iVar9 = *(int *)&this->field_0x44 + 2;
    iVar10 = this->TabHeight + iVar9;
  }
  else {
    iVar10 = *(int *)&this->field_0x4c;
    iVar9 = iVar10 - this->TabHeight;
  }
  if ((*(int *)&this->field_0x40 <= xpos) &&
     ((ypos <= iVar10 && xpos <= *(int *)&this->field_0x48) && iVar9 <= ypos)) {
    uVar7 = this->CurrentScrollTabIndex;
    ppIVar8 = (this->Tabs).m_data.
              super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((int)uVar7 <
        (int)((ulong)((long)(this->Tabs).m_data.
                            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar8) >> 3)) {
      bVar13 = false;
      bVar12 = false;
      iVar11 = *(int *)&this->field_0x40 + 2;
      do {
        if (ppIVar8[uVar7] == (IGUITab *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (**(code **)(*(long *)&(ppIVar8[uVar7]->super_IGUIElement).super_IEventReceiver +
                              0xa8))();
        }
        if (plVar4 == (long *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar2 = (**(code **)(*plVar4 + 8))(plVar4,uVar5);
          iVar2 = iVar2 + this->TabExtraWidth;
          iVar3 = this->TabMaxWidth;
          iVar6 = iVar3;
          if (iVar2 < iVar3) {
            iVar6 = iVar2;
          }
          if (iVar3 < 1) {
            iVar6 = iVar2;
          }
        }
        if ((this->ScrollControl == true) &&
           (iVar3 = ((this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X - iVar11) +
                    -2, bVar12 = bVar13, iVar3 < iVar6)) {
          bVar12 = true;
          iVar6 = iVar3;
          bVar13 = bVar12;
        }
        if (xpos < iVar11) {
          bVar1 = false;
        }
        else {
          bVar1 = (iVar9 <= ypos && ypos <= iVar10) && xpos <= iVar6 + iVar11;
        }
        if (bVar1) {
          return uVar7;
        }
        uVar7 = uVar7 + 1;
        ppIVar8 = (this->Tabs).m_data.
                  super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (((int)uVar7 <
                (int)((ulong)((long)(this->Tabs).m_data.
                                    super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar8) >> 3
                     )) && (iVar11 = iVar6 + iVar11, !bVar12));
    }
  }
  return 0xffffffff;
}

Assistant:

s32 CGUITabControl::getTabAt(s32 xpos, s32 ypos) const
{
	core::position2di p(xpos, ypos);
	IGUISkin *skin = Environment->getSkin();
	IGUIFont *font = skin->getFont();

	core::rect<s32> frameRect(AbsoluteRect);

	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		frameRect.UpperLeftCorner.Y += 2;
		frameRect.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y + TabHeight;
	} else {
		frameRect.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - TabHeight;
	}

	s32 pos = frameRect.UpperLeftCorner.X + 2;

	if (!frameRect.isPointInside(p))
		return -1;

	bool abort = false;
	for (s32 i = CurrentScrollTabIndex; i < (s32)Tabs.size() && !abort; ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i])
			text = Tabs[i]->getText();

		// get text length
		s32 len = calcTabWidth(font, text);
		if (ScrollControl) {
			// TODO: merge this with draw() ?
			s32 space = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 - pos;
			if (space < len) {
				abort = true;
				len = space;
			}
		}

		frameRect.UpperLeftCorner.X = pos;
		frameRect.LowerRightCorner.X = frameRect.UpperLeftCorner.X + len;

		pos += len;

		if (frameRect.isPointInside(p)) {
			return i;
		}
	}
	return -1;
}